

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-memory.c
# Opt level: O1

int luaopen_memory(lua_State *L)

{
  long lVar1;
  undefined **ppuVar2;
  luaL_Reg *plVar3;
  byte bVar4;
  luaL_Reg l [8];
  luaL_Reg alStack_98 [8];
  
  bVar4 = 0;
  luaL_checkversion_(L,503.0,0x88);
  ppuVar2 = &PTR_anon_var_dwarf_10e01_001625e0;
  plVar3 = alStack_98;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    plVar3->name = *ppuVar2;
    ppuVar2 = ppuVar2 + (ulong)bVar4 * -2 + 1;
    plVar3 = (luaL_Reg *)((long)plVar3 + ((ulong)bVar4 * -2 + 1) * 8);
  }
  luaL_checkversion_(L,503.0,0x88);
  lua_createtable(L,0,7);
  luaL_setfuncs(L,alStack_98,0);
  return 1;
}

Assistant:

int
luaopen_memory(lua_State *L) {
	luaL_checkversion(L);

	luaL_Reg l[] = {
		{ "total", ltotal },
		{ "block", lblock },
		{ "dumpinfo", ldumpinfo },
		{ "dump", ldump },
		{ "info", dump_mem_lua },
		{ "ssinfo", luaS_shrinfo },
		{ "ssexpand", lexpandshrtbl },
		{ NULL, NULL },
	};

	luaL_newlib(L,l);

	return 1;
}